

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# univalue_get.cpp
# Opt level: O3

double __thiscall UniValue::get_real(UniValue *this)

{
  byte bVar1;
  uint uVar2;
  size_t sVar3;
  byte *__s;
  size_t sVar4;
  runtime_error *this_00;
  long in_FS_OFFSET;
  istringstream text;
  double local_1b8;
  locale local_1b0 [8];
  undefined8 local_1a8;
  uint auStack_188 [22];
  ios_base local_130 [264];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_1a8._0_4_ = VNUM;
  checkType(this,(VType *)&local_1a8);
  sVar3 = (this->val)._M_string_length;
  if (sVar3 != 0) {
    __s = (byte *)(this->val)._M_dataplus._M_p;
    bVar1 = *__s;
    if (((0x20 < (ulong)bVar1) || ((0x100002600U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) &&
       ((0x20 < (ulong)__s[sVar3 - 1] || ((0x100002600U >> ((ulong)__s[sVar3 - 1] & 0x3f) & 1) == 0)
        ))) {
      sVar4 = strlen((char *)__s);
      if ((sVar4 == sVar3) && ((bVar1 != 0x30 || sVar3 == 1 || (__s[1] != 0x78)))) {
        std::__cxx11::istringstream::istringstream
                  ((istringstream *)&local_1a8,(string *)&this->val,_S_in);
        std::locale::classic();
        std::ios::imbue(local_1b0);
        std::locale::~locale(local_1b0);
        std::istream::_M_extract<double>((double *)&local_1a8);
        uVar2 = *(uint *)((long)auStack_188 +
                         *(long *)(CONCAT44(local_1a8._4_4_,(VType)local_1a8) + -0x18));
        std::__cxx11::istringstream::~istringstream((istringstream *)&local_1a8);
        std::ios_base::~ios_base(local_130);
        if ((uVar2 & 7) == 2) {
          if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
            return local_1b8;
          }
          goto LAB_0017abf3;
        }
      }
    }
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"JSON double out of range");
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
LAB_0017abf3:
  __stack_chk_fail();
}

Assistant:

double UniValue::get_real() const
{
    checkType(VNUM);
    double retval;
    if (!ParseDouble(getValStr(), &retval))
        throw std::runtime_error("JSON double out of range");
    return retval;
}